

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::RegistryTest_build_histogram_family_Test::
~RegistryTest_build_histogram_family_Test(RegistryTest_build_histogram_family_Test *this)

{
  RegistryTest_build_histogram_family_Test *this_local;
  
  ~RegistryTest_build_histogram_family_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(RegistryTest, build_histogram_family) {
  Registry registry{};
  auto& histogram_family =
      BuildHistogram().Name("hist").Help("Test Histogram").Register(registry);
  auto& histogram = histogram_family.Add({{"name", "test_histogram_1"}},
                                         Histogram::BucketBoundaries{0, 1, 2});
  histogram.Observe(1.1);
  auto collected = registry.Collect();
  ASSERT_EQ(collected.size(), 1U);
}